

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adksys_procfs.c
# Opt level: O0

int adksys_get_cmdline_buffer(char **output_buffer,int *output_size)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  int *piVar4;
  size_t result;
  char *buffer;
  size_t size;
  size_t bytes_read;
  FILE *f;
  int *output_size_local;
  char **output_buffer_local;
  
  size = 0;
  buffer = (char *)0x0;
  result = 0;
  __stream = fopen("/proc/self/cmdline","r");
  if (__stream != (FILE *)0x0) {
    while (iVar1 = feof(__stream), iVar1 == 0) {
      fgetc(__stream);
      buffer = buffer + 1;
    }
    pcVar2 = buffer + -1;
    result = (size_t)malloc((size_t)buffer);
    if ((char *)result != (char *)0x0) {
      memset((void *)result,0,(size_t)buffer);
      fseek(__stream,0,0);
      do {
        sVar3 = fread((char *)(result + size),1,(long)pcVar2 - size,__stream);
        if ((sVar3 != 0) || (piVar4 = __errno_location(), *piVar4 != 4)) {
          if ((sVar3 == 0) && (iVar1 = feof(__stream), iVar1 != 0)) break;
          if (sVar3 == 0) goto LAB_0010559c;
          size = sVar3 + size;
        }
      } while (size < pcVar2);
      fclose(__stream);
      *output_buffer = (char *)result;
      *output_size = (int)pcVar2;
      return 0;
    }
  }
LAB_0010559c:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (result != 0) {
    free((void *)result);
  }
  return -1;
}

Assistant:

int adksys_get_cmdline_buffer(char **output_buffer, int *output_size)
{
   FILE *f = NULL;
   size_t bytes_read = 0, size = 0;
   char *buffer = NULL;
   size_t result;
   
   f = fopen("/proc/self/cmdline", "r");
   if (!f)
      goto error;
   while (!feof(f)) {
      fgetc(f);
      size += 1;
   }
   size--;
   buffer = (char *) malloc(size+1);
   if (!buffer)
      goto error;
   memset(buffer, 0, size+1);
   
   result = fseek(f, SEEK_SET, 0);
   do {
      result = fread(buffer + bytes_read, 1, size - bytes_read, f);
      if (result == 0 && errno == EINTR)
         continue;
      else if (result == 0 && feof(f))
         break;
      else if (result == 0)
         goto error;
      bytes_read += result;
   } while (bytes_read < size);

   fclose(f);
   *output_buffer = buffer;
   *output_size = size;
   return 0;
   
  error:
   if (f)
      fclose(f);
   if (buffer)
      free(buffer);
   return -1;
}